

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O2

void __thiscall OPL3::initOperators(OPL3 *this)

{
  Operator *pOVar1;
  int iVar2;
  Operator *(*papOVar3) [32];
  int group;
  ulong uVar4;
  int array;
  long lVar5;
  int offset;
  Operator *(*__s) [32];
  long lVar6;
  int iVar7;
  
  __s = this->operators;
  iVar2 = 0;
  memset(__s,0,0x200);
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    papOVar3 = __s;
    iVar7 = iVar2;
    for (uVar4 = 0; uVar4 < 0x11; uVar4 = uVar4 + 8) {
      for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
        pOVar1 = (Operator *)operator_new(0xb8);
        (pOVar1->phaseGenerator).phase = 0.0;
        (pOVar1->phaseGenerator).phaseIncrement = 0.0;
        (pOVar1->envelopeGenerator).stage = OFF;
        (pOVar1->envelopeGenerator).actualAttackRate = 0;
        (pOVar1->envelopeGenerator).actualDecayRate = 0;
        *(undefined8 *)&(pOVar1->envelopeGenerator).actualReleaseRate = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).xAttackIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).xMinimumInAttack + 4) = 0;
        *(undefined4 *)((long)&(pOVar1->envelopeGenerator).sustainLevel + 4) = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).dBdecayIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).dBreleaseIncrement + 4) = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).attenuation + 4) = 0;
        *(undefined8 *)((long)&(pOVar1->envelopeGenerator).totalLevel + 4) = 0;
        (pOVar1->envelopeGenerator).x = 6.584962500721156;
        (pOVar1->envelopeGenerator).envelope = -96.0;
        pOVar1->operatorBaseAddress = iVar7 + (int)lVar6;
        pOVar1->envelope = 0.0;
        pOVar1->am = 0;
        pOVar1->vib = 0;
        pOVar1->ksr = 0;
        pOVar1->egt = 0;
        pOVar1->mult = 0;
        pOVar1->ksl = 0;
        pOVar1->tl = 0;
        pOVar1->ar = 0;
        pOVar1->dr = 0;
        pOVar1->sl = 0;
        pOVar1->rr = 0;
        pOVar1->ws = 0;
        pOVar1->ws = 0;
        pOVar1->keyScaleNumber = 0;
        pOVar1->f_number = 0;
        pOVar1->block = 0;
        (*papOVar3)[lVar6] = pOVar1;
      }
      iVar7 = iVar7 + 8;
      papOVar3 = (Operator *(*) [32])(*papOVar3 + 8);
    }
    iVar2 = iVar2 + 0x100;
    __s = __s + 1;
  }
  pOVar1 = this->operators[0][0x12];
  this->highHatOperatorInNonRhythmMode = this->operators[0][0x11];
  this->snareDrumOperatorInNonRhythmMode = this->operators[0][0x14];
  this->tomTomOperatorInNonRhythmMode = pOVar1;
  this->topCymbalOperatorInNonRhythmMode = this->operators[0][0x15];
  return;
}

Assistant:

void OPL3::initOperators() {
    int baseAddress;
    // The YMF262 has 36 operators:
	memset(operators, 0, sizeof(operators));
    for(int array=0; array<2; array++)
        for(int group = 0; group<=0x10; group+=8)
            for(int offset=0; offset<6; offset++) {
                baseAddress = (array<<8) | (group+offset);
                operators[array][group+offset] = new Operator(baseAddress);
            }
    
    // Save operators when they are in non-rhythm mode:
    // Channel 7:
    highHatOperatorInNonRhythmMode = operators[0][0x11];
    snareDrumOperatorInNonRhythmMode = operators[0][0x14];
    // Channel 8:
    tomTomOperatorInNonRhythmMode = operators[0][0x12];
    topCymbalOperatorInNonRhythmMode = operators[0][0x15];
    
}